

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall
HighsMipSolverData::solutionRowFeasible
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  double dVar3;
  double rowactivity;
  HighsInt j;
  HighsInt end;
  HighsInt start;
  HighsCDouble c_double_rowactivity;
  HighsInt i;
  undefined4 in_stack_ffffffffffffff78;
  HighsInt in_stack_ffffffffffffff7c;
  HighsMipSolver *in_stack_ffffffffffffff80;
  HighsMipSolver *this_01;
  HighsCDouble local_50;
  value_type local_3c;
  int local_38;
  value_type local_34;
  HighsCDouble local_30;
  int local_1c;
  vector<double,_std::allocator<double>_> *local_18;
  
  local_1c = 0;
  local_18 = in_RSI;
  while( true ) {
    if (local_1c == *(int *)(*(long *)(*in_RDI + 0x10) + 4)) {
      return true;
    }
    HighsCDouble::HighsCDouble(&local_30,0.0);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc86),(long)local_1c);
    local_34 = *pvVar1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc86),(long)(local_1c + 1));
    local_38 = *pvVar1;
    this_01 = in_stack_ffffffffffffff80;
    for (local_3c = local_34; this_00 = local_18, local_3c != local_38; local_3c = local_3c + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc89),(long)local_3c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar1);
      dVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc8c),(long)local_3c
                         );
      HighsCDouble::HighsCDouble(&local_50,dVar3 * *pvVar2);
      HighsCDouble::operator+=
                ((HighsCDouble *)this_01,
                 (HighsCDouble *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    in_stack_ffffffffffffff80 = (HighsMipSolver *)HighsCDouble::operator_cast_to_double(&local_30);
    dVar3 = HighsMipSolver::rowUpper(this_01,in_stack_ffffffffffffff7c);
    if (dVar3 + (double)in_RDI[0xcc4] < (double)in_stack_ffffffffffffff80) break;
    dVar3 = HighsMipSolver::rowLower(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    if ((double)in_stack_ffffffffffffff80 < dVar3 - (double)in_RDI[0xcc4]) {
      return false;
    }
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool HighsMipSolverData::solutionRowFeasible(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    HighsCDouble c_double_rowactivity = HighsCDouble(0.0);

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      c_double_rowactivity += HighsCDouble(solution[ARindex_[j]] * ARvalue_[j]);

    double rowactivity = double(c_double_rowactivity);
    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }
  return true;
}